

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockHierarchyTest.cpp
# Opt level: O3

void __thiscall
TEST_MockHierarchyTest_checkExpectationsWorksHierarchically_Test::testBody
          (TEST_MockHierarchyTest_checkExpectationsWorksHierarchically_Test *this)

{
  UtestShell *test;
  MockSupport *pMVar1;
  MockFailureReporterInstaller failureReporterInstaller;
  MockExpectedCallsListForTest expectations;
  MockExpectedCallsDidntHappenFailure expectedFailure;
  MockFailureReporterInstaller local_a1;
  SimpleString local_a0;
  SimpleString local_90;
  MockExpectedCallsList local_80;
  TestFailure local_70;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_a1);
  MockExpectedCallsList::MockExpectedCallsList(&local_80);
  local_80._vptr_MockExpectedCallsList = (_func_int **)&PTR__MockExpectedCallsListForTest_002aa030;
  SimpleString::SimpleString((SimpleString *)&local_70,"first::foobar");
  MockExpectedCallsListForTest::addFunction
            ((MockExpectedCallsListForTest *)&local_80,(SimpleString *)&local_70);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  SimpleString::SimpleString((SimpleString *)&local_70,"second::helloworld");
  MockExpectedCallsListForTest::addFunction
            ((MockExpectedCallsListForTest *)&local_80,(SimpleString *)&local_70);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  test = mockFailureTest();
  MockExpectedCallsDidntHappenFailure::MockExpectedCallsDidntHappenFailure
            ((MockExpectedCallsDidntHappenFailure *)&local_70,test,&local_80);
  SimpleString::SimpleString(&local_a0,"first");
  pMVar1 = mock(&local_a0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"foobar");
  (*pMVar1->_vptr_MockSupport[3])(pMVar1,&local_90);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::SimpleString(&local_a0,"second");
  pMVar1 = mock(&local_a0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"helloworld");
  (*pMVar1->_vptr_MockSupport[3])(pMVar1,&local_90);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::SimpleString(&local_a0,"");
  pMVar1 = mock(&local_a0,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x25])(pMVar1);
  SimpleString::~SimpleString(&local_a0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockHierarchyTest.cpp"
             ,0x6d);
  TestFailure::~TestFailure(&local_70);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_80);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_a1);
  return;
}

Assistant:

TEST(MockHierarchyTest, checkExpectationsWorksHierarchically)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("first::foobar");
    expectations.addFunction("second::helloworld");
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock("first").expectOneCall("foobar");
    mock("second").expectOneCall("helloworld");

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}